

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherGeneric.cpp
# Opt level: O3

bool __thiscall efsw::WatcherGeneric::pathInWatches(WatcherGeneric *this,string *path)

{
  DirWatcherGeneric *this_00;
  pointer pcVar1;
  bool bVar2;
  string local_38;
  
  this_00 = this->DirWatch;
  pcVar1 = (path->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + path->_M_string_length);
  bVar2 = DirWatcherGeneric::pathInWatches(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool WatcherGeneric::pathInWatches( std::string path ) {
	return DirWatch->pathInWatches( path );
}